

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall diff_match_patch_test::testMatchBitap(diff_match_patch_test *this)

{
  int iVar1;
  diff_match_patch_test *pdVar2;
  allocator<wchar_t> local_6b;
  allocator<wchar_t> local_6a;
  allocator<wchar_t> local_69;
  wstring local_68 [32];
  wstring local_48 [32];
  wstring local_28;
  
  *(undefined8 *)&this->field_0x8 = 0x643f000000;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Exact match #1.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdefghijk",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"fgh",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,5,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Exact match #2.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdefghijk",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"fgh",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,5,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Fuzzy match #1.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdefghijk",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"efxhi",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,4,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Fuzzy match #2.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdefghijk",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"cdefxyhijk",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,2,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Fuzzy match #3.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdefghijk",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"bxy",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,-1,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Overflow.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"123456789xx0",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"3456789x0",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,2,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Before start match.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdef",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"xxabc",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,0,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Beyond end match.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdef",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"defyy",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,3,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Oversized pattern.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdef",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"xabcdefy",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,0,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  *(undefined4 *)&this->field_0x8 = 0x3ecccccd;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Threshold #1.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdefghijk",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"efxyhi",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,4,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  *(undefined4 *)&this->field_0x8 = 0x3e99999a;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Threshold #2.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdefghijk",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"efxyhi",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,-1,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  *(undefined4 *)&this->field_0x8 = 0;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Threshold #3.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdefghijk",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"bcdef",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,1,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  *(undefined4 *)&this->field_0x8 = 0x3f000000;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Multiple select #1.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdexyzabcde",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abccde",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,0,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Multiple select #2.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdexyzabcde",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abccde",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,8,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  *(undefined4 *)&this->field_0xc = 10;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Distance test #1.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_48,L"abcdefghijklmnopqrstuvwxyz",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abcdefg",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,-1,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Distance test #2.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_48,L"abcdefghijklmnopqrstuvwxyz",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abcdxxefg",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(pdVar2,&local_28,0,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  *(undefined4 *)&this->field_0xc = 1000;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"match_bitap: Distance test #3.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_48,L"abcdefghijklmnopqrstuvwxyz",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abcdefg",&local_6b);
  iVar1 = diff_match_patch::match_bitap((wstring *)this,local_48,(int)local_68);
  assertEquals(this,&local_28,0,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  return;
}

Assistant:

void diff_match_patch_test::testMatchBitap() {
  // Bitap algorithm.
  dmp.Match_Distance = 100;
  dmp.Match_Threshold = 0.5f;
  assertEquals(L"match_bitap: Exact match #1.", 5, dmp.match_bitap(L"abcdefghijk", L"fgh", 5));

  assertEquals(L"match_bitap: Exact match #2.", 5, dmp.match_bitap(L"abcdefghijk", L"fgh", 0));

  assertEquals(L"match_bitap: Fuzzy match #1.", 4, dmp.match_bitap(L"abcdefghijk", L"efxhi", 0));

  assertEquals(L"match_bitap: Fuzzy match #2.", 2, dmp.match_bitap(L"abcdefghijk", L"cdefxyhijk", 5));

  assertEquals(L"match_bitap: Fuzzy match #3.", -1, dmp.match_bitap(L"abcdefghijk", L"bxy", 1));

  assertEquals(L"match_bitap: Overflow.", 2, dmp.match_bitap(L"123456789xx0", L"3456789x0", 2));

  assertEquals(L"match_bitap: Before start match.", 0, dmp.match_bitap(L"abcdef", L"xxabc", 4));

  assertEquals(L"match_bitap: Beyond end match.", 3, dmp.match_bitap(L"abcdef", L"defyy", 4));

  assertEquals(L"match_bitap: Oversized pattern.", 0, dmp.match_bitap(L"abcdef", L"xabcdefy", 0));

  dmp.Match_Threshold = 0.4f;
  assertEquals(L"match_bitap: Threshold #1.", 4, dmp.match_bitap(L"abcdefghijk", L"efxyhi", 1));

  dmp.Match_Threshold = 0.3f;
  assertEquals(L"match_bitap: Threshold #2.", -1, dmp.match_bitap(L"abcdefghijk", L"efxyhi", 1));

  dmp.Match_Threshold = 0.0f;
  assertEquals(L"match_bitap: Threshold #3.", 1, dmp.match_bitap(L"abcdefghijk", L"bcdef", 1));

  dmp.Match_Threshold = 0.5f;
  assertEquals(L"match_bitap: Multiple select #1.", 0, dmp.match_bitap(L"abcdexyzabcde", L"abccde", 3));

  assertEquals(L"match_bitap: Multiple select #2.", 8, dmp.match_bitap(L"abcdexyzabcde", L"abccde", 5));

  dmp.Match_Distance = 10;  // Strict location.
  assertEquals(L"match_bitap: Distance test #1.", -1, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdefg", 24));

  assertEquals(L"match_bitap: Distance test #2.", 0, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdxxefg", 1));

  dmp.Match_Distance = 1000;  // Loose location.
  assertEquals(L"match_bitap: Distance test #3.", 0, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdefg", 24));
}